

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::StrictMock<MockUnaryVisitor>::StrictMock(StrictMock<MockUnaryVisitor> *this)

{
  FunctionMocker<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>)>
  *this_00;
  
  (this->super_MockUnaryVisitor).super_ExprVisitor<MockUnaryVisitor,_TestResult>.
  super_BasicExprVisitor<MockUnaryVisitor,_TestResult,_mp::internal::ExprTypes>.
  _vptr_BasicExprVisitor = (_func_int **)&PTR__MockUnaryVisitor_001e4c70;
  this_00 = &(this->super_MockUnaryVisitor).gmock1_VisitUnary_251;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this_00);
  (this->super_MockUnaryVisitor).gmock1_VisitUnary_251.
  super_FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>)>
  .current_spec_.function_mocker_ =
       &this_00->
        super_FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>)>
  ;
  ((linked_ptr<const_testing::MatcherInterface<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>_>
    *)((long)&(this->super_MockUnaryVisitor).gmock1_VisitUnary_251.
              super_FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>)>
              .current_spec_.matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>_>
              .
              super__Head_base<0UL,_testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>,_false>
      + 8))->value_ =
       (MatcherInterface<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
        *)0x0;
  ((linked_ptr_internal *)
  ((long)&(this->super_MockUnaryVisitor).gmock1_VisitUnary_251.
          super_FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>)>
          .current_spec_.matchers_.
          super__Tuple_impl<0UL,_testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>_>
          .
          super__Head_base<0UL,_testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>,_false>
  + 0x10))->next_ =
       (linked_ptr_internal *)
       ((long)&(this->super_MockUnaryVisitor).gmock1_VisitUnary_251.
               super_FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>)>
               .current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>_>
               .
               super__Head_base<0UL,_testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>,_false>
       + 0x10);
  (this->super_MockUnaryVisitor).gmock1_VisitUnary_251.
  super_FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>)>
  .current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>_>
  .
  super__Head_base<0UL,_testing::Matcher<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>,_false>
  ._M_head_impl.
  super_MatcherBase<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>_>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001e1570;
  (this->super_MockUnaryVisitor).gmock1_VisitUnary_251.
  super_FunctionMockerBase<TestResult_(mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>)>
  .super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001e14a0;
  (this->super_MockUnaryVisitor).super_ExprVisitor<MockUnaryVisitor,_TestResult>.
  super_BasicExprVisitor<MockUnaryVisitor,_TestResult,_mp::internal::ExprTypes>.
  _vptr_BasicExprVisitor = (_func_int **)&PTR__StrictMock_001e4bf8;
  Mock::FailUninterestingCalls(this);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }